

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::NamespacePrinter::NamespacePrinter
          (NamespacePrinter *this,Printer *p,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *namespace_components)

{
  Printer *pPVar1;
  bool bVar2;
  Printer **ppPVar3;
  Arg *in_R8;
  string_view sVar4;
  string_view local_d0 [2];
  Arg local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  string local_70;
  string_view local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string *ns;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *namespace_components_local;
  Printer *p_local;
  NamespacePrinter *this_local;
  
  namespace_components_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)p;
  p_local = (Printer *)this;
  ppPVar3 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::io::Printer*const&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/namespace_printer.cc"
                       ,0x12,"p",(Printer **)&namespace_components_local);
  this->p_ = *ppPVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->namespace_components_,namespace_components);
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->namespace_components_);
  ns = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->namespace_components_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&ns);
    if (!bVar2) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
    pPVar1 = this->p_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"namespace $0 {\n");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_b0,local_40);
    sVar4._M_str = (char *)&local_b0;
    sVar4._M_len = (size_t)local_80._M_str;
    absl::lts_20250127::Substitute_abi_cxx11_(&local_70,(lts_20250127 *)local_80._M_len,sVar4,in_R8)
    ;
    sVar4 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
    local_50 = sVar4;
    protobuf::io::Printer::Print<>(pPVar1,sVar4);
    std::__cxx11::string::~string((string *)&local_70);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  }
  pPVar1 = this->p_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_d0,"\n");
  protobuf::io::Printer::Print<>(pPVar1,local_d0[0]);
  return;
}

Assistant:

NamespacePrinter::NamespacePrinter(
    google::protobuf::io::Printer* const p, std::vector<std::string> namespace_components)
    : p_(ABSL_DIE_IF_NULL(p)),
      namespace_components_(std::move(namespace_components)) {
  // Open the namespace.
  for (const std::string& ns : namespace_components_) {
    p_->Print(absl::Substitute("namespace $0 {\n", ns));
  }
  p_->Print("\n");
}